

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.h
# Opt level: O3

void __thiscall RigidBodyDynamics::Constraint::~Constraint(Constraint *this)

{
  pointer __ptr;
  pointer puVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_Constraint = (_func_int **)&PTR___cxa_pure_virtual_0019ac28;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->velocityConstraint).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->positionConstraint).super__Bvector_base<std::allocator<bool>_>);
  __ptr = (this->bodyFrames).
          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          .
          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (__ptr != (pointer)0x0) {
    free(__ptr);
  }
  puVar1 = (this->bodyIds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->bodyIds).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar3 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Constraint(){}